

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

SyntaxList<slang::syntax::DelayedSequenceElementSyntax> *
slang::syntax::deepClone<slang::syntax::DelayedSequenceElementSyntax>
          (SyntaxList<slang::syntax::DelayedSequenceElementSyntax> *node,BumpAllocator *alloc)

{
  pointer ppDVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  SyntaxList<slang::syntax::DelayedSequenceElementSyntax> *pSVar4;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  long lVar5;
  span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL> *args;
  SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL> buffer;
  span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL> local_80;
  SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL> local_70;
  
  SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL>::SmallVector
            (&local_70,
             (node->
             super_span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>).
             _M_extent._M_extent_value);
  ppDVar1 = (node->super_span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>
            )._M_ptr;
  sVar2 = (node->super_span<slang::syntax::DelayedSequenceElementSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  src = extraout_RDX;
  for (lVar5 = 0; sVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
    local_80._M_ptr = (pointer)deepClone(*(SyntaxNode **)((long)ppDVar1 + lVar5),alloc);
    SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*>::
    emplace_back<slang::syntax::DelayedSequenceElementSyntax*>
              ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*> *)&local_70,
               (DelayedSequenceElementSyntax **)&local_80);
    src = extraout_RDX_00;
  }
  iVar3 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::copy
                    (&local_70.super_SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>,
                     (EVP_PKEY_CTX *)alloc,src);
  local_80._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
  args = &local_80;
  pSVar4 = BumpAllocator::
           emplace<slang::syntax::SyntaxList<slang::syntax::DelayedSequenceElementSyntax>,std::span<slang::syntax::DelayedSequenceElementSyntax*,18446744073709551615ul>>
                     (alloc,args);
  SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::cleanup
            (&local_70.super_SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>,
             (EVP_PKEY_CTX *)args);
  return pSVar4;
}

Assistant:

SyntaxList<T>* deepClone(const SyntaxList<T>& node, BumpAllocator& alloc) {
    SmallVector<T*> buffer(node.size(), UninitializedTag());
    for (auto& t : node)
        buffer.push_back(deepClone(*t, alloc));

    return alloc.emplace<SyntaxList<T>>(buffer.copy(alloc));
}